

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_VisibilityFromSame_Test::
ValidationErrorTest_VisibilityFromSame_Test(ValidationErrorTest_VisibilityFromSame_Test *this)

{
  ValidationErrorTest_VisibilityFromSame_Test *this_local;
  
  ValidationErrorTest::ValidationErrorTest(&this->super_ValidationErrorTest);
  (this->super_ValidationErrorTest).super_Test._vptr_Test =
       (_func_int **)&PTR__ValidationErrorTest_VisibilityFromSame_Test_029aede8;
  return;
}

Assistant:

TEST_F(ValidationErrorTest, VisibilityFromSame) {
  ParseAndBuildFile("vis.proto", R"schema(
        edition = "2024";
        package vis.test;

        local message LocalMessage {
        }
        export message ExportMessage {
          LocalMessage foo = 1;
        }
        )schema");
}